

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_chars.hpp
# Opt level: O0

diyfp __thiscall nlohmann::detail::dtoa_impl::diyfp::normalize(diyfp *this,diyfp x)

{
  diyfp dVar1;
  diyfp *pdStack_28;
  diyfp x_local;
  
  x_local.f._0_4_ = (int)x.f;
  pdStack_28 = this;
  if (this == (diyfp *)0x0) {
    __assert_fail("x.f != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SamNormcoreWayne[P]AdhocQueryProcessing/MFQueryInputParser/include/nlohmann/detail/conversions/to_chars.hpp"
                  ,0x8e,"static diyfp nlohmann::detail::dtoa_impl::diyfp::normalize(diyfp)");
  }
  for (; -1 < (long)pdStack_28; pdStack_28 = (diyfp *)((long)pdStack_28 << 1)) {
    x_local.f._0_4_ = (int)x_local.f + -1;
  }
  dVar1.e = (int)x_local.f;
  dVar1.f = (uint64_t)pdStack_28;
  dVar1._12_4_ = 0;
  return dVar1;
}

Assistant:

static diyfp normalize(diyfp x) noexcept
    {
        assert(x.f != 0);

        while ((x.f >> 63u) == 0)
        {
            x.f <<= 1u;
            x.e--;
        }

        return x;
    }